

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outchars.c
# Opt level: O1

curses_drawing_info * load_nh_drawing_info(nh_drawing_info *orig)

{
  wchar_t len;
  curses_drawing_info *pcVar1;
  curses_symdef_conflict *pcVar2;
  
  pcVar1 = (curses_drawing_info *)malloc(0x90);
  len = orig->num_bgelements;
  pcVar1->num_bgelements = len;
  pcVar1->num_traps = orig->num_traps;
  pcVar1->num_objects = orig->num_objects;
  pcVar1->num_monsters = orig->num_monsters;
  pcVar1->num_warnings = orig->num_warnings;
  pcVar1->num_expltypes = orig->num_expltypes;
  pcVar1->num_zaptypes = orig->num_zaptypes;
  pcVar1->num_effects = orig->num_effects;
  pcVar1->bg_feature_offset = orig->bg_feature_offset;
  pcVar2 = load_nh_symarray(orig->bgelements,len);
  pcVar1->bgelements = pcVar2;
  pcVar2 = load_nh_symarray(orig->traps,orig->num_traps);
  pcVar1->traps = pcVar2;
  pcVar2 = load_nh_symarray(orig->objects,orig->num_objects);
  pcVar1->objects = pcVar2;
  pcVar2 = load_nh_symarray(orig->monsters,orig->num_monsters);
  pcVar1->monsters = pcVar2;
  pcVar2 = load_nh_symarray(orig->warnings,orig->num_warnings);
  pcVar1->warnings = pcVar2;
  pcVar2 = load_nh_symarray(orig->invis,L'\x01');
  pcVar1->invis = pcVar2;
  pcVar2 = load_nh_symarray(orig->effects,orig->num_effects);
  pcVar1->effects = pcVar2;
  pcVar2 = load_nh_symarray(orig->expltypes,orig->num_expltypes);
  pcVar1->expltypes = pcVar2;
  pcVar2 = load_nh_symarray(orig->explsyms,L'\t');
  pcVar1->explsyms = pcVar2;
  pcVar2 = load_nh_symarray(orig->zaptypes,orig->num_zaptypes);
  pcVar1->zaptypes = pcVar2;
  pcVar2 = load_nh_symarray(orig->zapsyms,L'\x04');
  pcVar1->zapsyms = pcVar2;
  pcVar2 = load_nh_symarray(orig->breathsyms,L'\x04');
  pcVar1->breathsyms = pcVar2;
  pcVar2 = load_nh_symarray(orig->swallowsyms,L'\b');
  pcVar1->swallowsyms = pcVar2;
  return pcVar1;
}

Assistant:

static struct curses_drawing_info *load_nh_drawing_info(const struct nh_drawing_info *orig)
{
    struct curses_drawing_info *copy = malloc(sizeof(struct curses_drawing_info));
    
    copy->num_bgelements = orig->num_bgelements;
    copy->num_traps = orig->num_traps;
    copy->num_objects = orig->num_objects;
    copy->num_monsters = orig->num_monsters;
    copy->num_warnings = orig->num_warnings;
    copy->num_expltypes = orig->num_expltypes;
    copy->num_zaptypes = orig->num_zaptypes;
    copy->num_effects = orig->num_effects;
    copy->bg_feature_offset = orig->bg_feature_offset;
    
    copy->bgelements = load_nh_symarray(orig->bgelements, orig->num_bgelements);
    copy->traps = load_nh_symarray(orig->traps, orig->num_traps);
    copy->objects = load_nh_symarray(orig->objects, orig->num_objects);
    copy->monsters = load_nh_symarray(orig->monsters, orig->num_monsters);
    copy->warnings = load_nh_symarray(orig->warnings, orig->num_warnings);
    copy->invis = load_nh_symarray(orig->invis, 1);
    copy->effects = load_nh_symarray(orig->effects, orig->num_effects);
    copy->expltypes = load_nh_symarray(orig->expltypes, orig->num_expltypes);
    copy->explsyms = load_nh_symarray(orig->explsyms, NUMEXPCHARS);
    copy->zaptypes = load_nh_symarray(orig->zaptypes, orig->num_zaptypes);
    copy->zapsyms = load_nh_symarray(orig->zapsyms, NUMZAPCHARS);
    copy->breathsyms = load_nh_symarray(orig->breathsyms, NUMBREATHCHARS);
    copy->swallowsyms = load_nh_symarray(orig->swallowsyms, NUMSWALLOWCHARS);
    
    return copy;
}